

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::set_up_values_of_landscapes
          (Persistence_landscape_on_grid *this,
          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *p,
          double grid_min_,double grid_max_,size_t number_of_points_,uint number_of_levels)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_type sVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long lVar9;
  ostream *poVar10;
  void *pvVar11;
  reference pvVar12;
  reference pvVar13;
  value_type vVar14;
  reference pvVar15;
  iterator iVar16;
  iterator iVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  size_type local_150;
  size_t pt_1;
  size_t j;
  size_t pt;
  value_type_conflict local_128;
  double *local_120;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_118;
  double *local_110;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_108;
  double local_100;
  size_t i_3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_f0;
  value_type_conflict local_e8;
  double *local_e0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_d8;
  double *local_d0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_c8;
  double local_c0;
  size_t i_2;
  double landscape_value;
  size_t grid_interval_midpoint;
  size_t grid_interval_end;
  size_t grid_interval_begin;
  size_t int_no;
  double dx;
  allocator<std::vector<double,_std::allocator<double>_>_> local_71;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_70;
  size_type local_58;
  size_t i_1;
  double max;
  double min;
  size_t i;
  bool dbg;
  size_t sStack_30;
  uint number_of_levels_local;
  size_t number_of_points__local;
  double grid_max__local;
  double grid_min__local;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *p_local;
  Persistence_landscape_on_grid *this_local;
  
  i._3_1_ = 0;
  i._4_4_ = number_of_levels;
  sStack_30 = number_of_points_;
  number_of_points__local = (size_t)grid_max_;
  grid_max__local = grid_min_;
  grid_min__local = (double)p;
  p_local = (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)this;
  dVar18 = std::numeric_limits<double>::max();
  sVar1 = number_of_points__local;
  if ((grid_min_ != dVar18) || (NAN(grid_min_) || NAN(dVar18))) {
    dVar18 = std::numeric_limits<double>::max();
    if (((double)sVar1 != dVar18) || (NAN((double)sVar1) || NAN(dVar18))) goto LAB_001043e3;
  }
  max = std::numeric_limits<double>::max();
  i_1 = (size_t)std::numeric_limits<double>::min();
  for (local_58 = 0; sVar6 = local_58,
      sVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )grid_min__local), dVar18 = grid_max__local, sVar6 != sVar4;
      local_58 = local_58 + 1) {
    pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)grid_min__local,local_58);
    if (pvVar5->first < max) {
      pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)grid_min__local,local_58);
      max = pvVar5->first;
    }
    pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)grid_min__local,local_58);
    if ((double)i_1 < pvVar5->second) {
      pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)grid_min__local,local_58);
      i_1 = (size_t)pvVar5->second;
    }
  }
  dVar19 = std::numeric_limits<double>::max();
  if ((dVar18 != dVar19) || (NAN(dVar18) || NAN(dVar19))) {
    number_of_points__local = i_1;
  }
  else {
    grid_max__local = max;
  }
LAB_001043e3:
  sVar6 = sStack_30 + 1;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_71);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_70,sVar6,&local_71);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->values_of_landscapes,&local_70);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_70);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_71);
  this->grid_min = grid_max__local;
  this->grid_max = (double)number_of_points__local;
  if ((double)number_of_points__local <= grid_max__local) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = 
    "Wrong parameters of grid_min and grid_max given to the procedure. The program will now terminate.\n"
    ;
    __cxa_throw(puVar7,&char_const*::typeinfo,0);
  }
  auVar21._8_4_ = (int)(sStack_30 >> 0x20);
  auVar21._0_8_ = sStack_30;
  auVar21._12_4_ = 0x45300000;
  int_no = (size_t)(((double)number_of_points__local - grid_max__local) /
                   ((auVar21._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sStack_30) - 4503599627370496.0)));
  for (grid_interval_begin = 0; sVar1 = grid_interval_begin,
      sVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )grid_min__local), uVar2 = i._4_4_, sVar1 != sVar6;
      grid_interval_begin = grid_interval_begin + 1) {
    pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)grid_min__local,grid_interval_begin);
    dVar18 = (pvVar5->first - grid_max__local) / (double)int_no;
    uVar8 = (ulong)dVar18;
    grid_interval_end = uVar8 | (long)(dVar18 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f;
    pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)grid_min__local,grid_interval_begin);
    dVar18 = (pvVar5->second - grid_max__local) / (double)int_no;
    uVar8 = (ulong)dVar18;
    grid_interval_midpoint = uVar8 | (long)(dVar18 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f;
    lVar9 = grid_interval_end + grid_interval_midpoint;
    auVar20._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar20._0_8_ = lVar9;
    auVar20._12_4_ = 0x45300000;
    dVar18 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * 0.5;
    uVar8 = (ulong)dVar18;
    landscape_value = (double)(uVar8 | (long)(dVar18 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f)
    ;
    if ((i._3_1_ & 1) != 0) {
      poVar10 = std::operator<<((ostream *)&std::clog,"Considering an interval : ");
      pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)grid_min__local,grid_interval_begin);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar5->first);
      poVar10 = std::operator<<(poVar10,",");
      pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)grid_min__local,grid_interval_begin);
      pvVar11 = (void *)std::ostream::operator<<(poVar10,pvVar5->second);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)&std::clog,"grid_interval_begin : ");
      pvVar11 = (void *)std::ostream::operator<<(poVar10,grid_interval_end);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)&std::clog,"grid_interval_end : ");
      pvVar11 = (void *)std::ostream::operator<<(poVar10,grid_interval_midpoint);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)&std::clog,"grid_interval_midpoint : ");
      pvVar11 = (void *)std::ostream::operator<<(poVar10,(ulong)landscape_value);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    }
    i_2 = int_no;
    local_c0 = (double)grid_interval_end;
    while (local_c0 = (double)((long)local_c0 + 1), (ulong)local_c0 < (ulong)landscape_value) {
      if ((i._3_1_ & 1) != 0) {
        poVar10 = std::operator<<((ostream *)&std::clog,
                                  "Adding landscape value (going up) for a point : ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(ulong)local_c0);
        poVar10 = std::operator<<(poVar10," equal : ");
        pvVar11 = (void *)std::ostream::operator<<(poVar10,(double)i_2);
        std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      }
      uVar2 = i._4_4_;
      uVar3 = std::numeric_limits<unsigned_int>::max();
      if (uVar2 == uVar3) {
        pvVar12 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&this->values_of_landscapes,(size_type)local_c0);
        std::vector<double,_std::allocator<double>_>::push_back(pvVar12,(value_type_conflict *)&i_2)
        ;
      }
      else {
        pvVar12 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&this->values_of_landscapes,(size_type)local_c0);
        sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar12);
        if (sVar6 < i._4_4_) {
          pvVar12 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&this->values_of_landscapes,(size_type)local_c0);
          local_e8 = -(double)i_2;
          std::vector<double,_std::allocator<double>_>::push_back(pvVar12,&local_e8);
          pvVar12 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&this->values_of_landscapes,(size_type)local_c0);
          sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar12);
          if (sVar6 == i._4_4_ - 1) {
            pvVar12 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_c0);
            local_f0._M_current =
                 (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar12);
            pvVar12 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_c0);
            i_3 = (size_t)std::vector<double,_std::allocator<double>_>::end(pvVar12);
            std::
            make_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                      (local_f0,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 )i_3);
          }
        }
        else {
          dVar18 = -(double)i_2;
          pvVar12 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&this->values_of_landscapes,(size_type)local_c0);
          pvVar13 = std::vector<double,_std::allocator<double>_>::front(pvVar12);
          if (dVar18 < *pvVar13) {
            pvVar12 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_c0);
            local_c8._M_current =
                 (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar12);
            pvVar12 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_c0);
            local_d0 = (double *)std::vector<double,_std::allocator<double>_>::end(pvVar12);
            std::
            pop_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                      (local_c8,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 )local_d0);
            vVar14 = -(double)i_2;
            pvVar12 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_c0);
            pvVar15 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_c0);
            sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar15);
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](pvVar12,sVar6 - 1);
            *pvVar13 = vVar14;
            pvVar12 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_c0);
            local_d8._M_current =
                 (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar12);
            pvVar12 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_c0);
            local_e0 = (double *)std::vector<double,_std::allocator<double>_>::end(pvVar12);
            std::
            push_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                      (local_d8,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 )local_e0);
          }
        }
      }
      i_2 = (size_t)((double)int_no + (double)i_2);
    }
    for (local_100 = landscape_value; uVar2 = i._4_4_, (ulong)local_100 <= grid_interval_midpoint;
        local_100 = (double)((long)local_100 + 1)) {
      if (0.0 < (double)i_2) {
        uVar3 = std::numeric_limits<unsigned_int>::max();
        if (uVar2 == uVar3) {
          pvVar12 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&this->values_of_landscapes,(size_type)local_100);
          std::vector<double,_std::allocator<double>_>::push_back
                    (pvVar12,(value_type_conflict *)&i_2);
        }
        else {
          pvVar12 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&this->values_of_landscapes,(size_type)local_100);
          sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar12);
          if (sVar6 < i._4_4_) {
            pvVar12 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_100);
            local_128 = -(double)i_2;
            std::vector<double,_std::allocator<double>_>::push_back(pvVar12,&local_128);
            pvVar12 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_100);
            sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar12);
            if (sVar6 == i._4_4_ - 1) {
              pvVar12 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&this->values_of_landscapes,(size_type)local_100);
              iVar16 = std::vector<double,_std::allocator<double>_>::begin(pvVar12);
              pvVar12 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&this->values_of_landscapes,(size_type)local_100);
              iVar17 = std::vector<double,_std::allocator<double>_>::end(pvVar12);
              std::
              make_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )iVar16._M_current,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )iVar17._M_current);
            }
          }
          else {
            dVar18 = -(double)i_2;
            pvVar12 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&this->values_of_landscapes,(size_type)local_100);
            pvVar13 = std::vector<double,_std::allocator<double>_>::front(pvVar12);
            if (dVar18 < *pvVar13) {
              pvVar12 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&this->values_of_landscapes,(size_type)local_100);
              local_108._M_current =
                   (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar12);
              pvVar12 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&this->values_of_landscapes,(size_type)local_100);
              local_110 = (double *)std::vector<double,_std::allocator<double>_>::end(pvVar12);
              std::
              pop_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (local_108,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )local_110);
              vVar14 = -(double)i_2;
              pvVar12 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&this->values_of_landscapes,(size_type)local_100);
              pvVar15 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&this->values_of_landscapes,(size_type)local_100);
              sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar15);
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](pvVar12,sVar6 - 1);
              *pvVar13 = vVar14;
              pvVar12 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&this->values_of_landscapes,(size_type)local_100);
              local_118._M_current =
                   (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar12);
              pvVar12 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[](&this->values_of_landscapes,(size_type)local_100);
              local_120 = (double *)std::vector<double,_std::allocator<double>_>::end(pvVar12);
              std::
              push_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (local_118,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )local_120);
            }
          }
        }
        if ((i._3_1_ & 1) != 0) {
          poVar10 = std::operator<<((ostream *)&std::clog,
                                    "Adding landscape value (going down) for a point : ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,(ulong)local_100);
          poVar10 = std::operator<<(poVar10," equal : ");
          pvVar11 = (void *)std::ostream::operator<<(poVar10,(double)i_2);
          std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
        }
      }
      i_2 = (size_t)((double)i_2 - (double)int_no);
    }
  }
  uVar3 = std::numeric_limits<unsigned_int>::max();
  if (uVar2 != uVar3) {
    for (j = 0; sVar6 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::size(&this->values_of_landscapes), j != sVar6; j = j + 1) {
      pt_1 = 0;
      while( true ) {
        pvVar12 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&this->values_of_landscapes,j);
        sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar12);
        if (pt_1 == sVar6) break;
        pvVar12 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&this->values_of_landscapes,j);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](pvVar12,pt_1);
        *pvVar13 = *pvVar13 * -1.0;
        pt_1 = pt_1 + 1;
      }
    }
  }
  for (local_150 = 0;
      sVar6 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&this->values_of_landscapes), local_150 != sVar6; local_150 = local_150 + 1) {
    pvVar12 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[](&this->values_of_landscapes,local_150);
    iVar16 = std::vector<double,_std::allocator<double>_>::begin(pvVar12);
    pvVar12 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[](&this->values_of_landscapes,local_150);
    iVar17 = std::vector<double,_std::allocator<double>_>::end(pvVar12);
    std::
    sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::greater<double>>
              (iVar16._M_current,iVar17._M_current);
  }
  return;
}

Assistant:

void Persistence_landscape_on_grid::set_up_values_of_landscapes(const std::vector<std::pair<double, double> >& p,
                                                                double grid_min_, double grid_max_,
                                                                size_t number_of_points_, unsigned number_of_levels) {
  bool dbg = false;
  if (dbg) {
    std::clog << "Here is the procedure : set_up_values_of_landscapes. The parameters are : grid_min_ : " << grid_min_
              << ", grid_max_ : " << grid_max_ << ", number_of_points_ : " << number_of_points_
              << ", number_of_levels: " << number_of_levels << std::endl;
    std::clog << "Here are the intervals at our disposal : \n";
    for (size_t i = 0; i != p.size(); ++i) {
      std::clog << p[i].first << " , " << p[i].second << std::endl;
    }
  }

  if ((grid_min_ == std::numeric_limits<double>::max()) || (grid_max_ == std::numeric_limits<double>::max())) {
    // in this case, we need to find grid_min_ and grid_min_ based on the data.
    double min = std::numeric_limits<double>::max();
    double max = std::numeric_limits<double>::min();
    for (size_t i = 0; i != p.size(); ++i) {
      if (p[i].first < min) min = p[i].first;
      if (p[i].second > max) max = p[i].second;
    }
    if (grid_min_ == std::numeric_limits<double>::max()) {
      grid_min_ = min;
    } else {
      // in this case grid_max_ == std::numeric_limits<double>::max()
      grid_max_ = max;
    }
  }

  // if number_of_levels == std::numeric_limits<size_t>::max(), then we will have all the nonzero values of landscapes,
  // and will store them in a vector
  // if number_of_levels != std::numeric_limits<size_t>::max(), then we will use those vectors as heaps.
  this->values_of_landscapes = std::vector<std::vector<double> >(number_of_points_ + 1);

  this->grid_min = grid_min_;
  this->grid_max = grid_max_;

  if (grid_max_ <= grid_min_) {
    throw "Wrong parameters of grid_min and grid_max given to the procedure. The program will now terminate.\n";
  }

  double dx = (grid_max_ - grid_min_) / static_cast<double>(number_of_points_);
  // for every interval in the diagram:
  for (size_t int_no = 0; int_no != p.size(); ++int_no) {
    size_t grid_interval_begin = (p[int_no].first - grid_min_) / dx;
    size_t grid_interval_end = (p[int_no].second - grid_min_) / dx;
    size_t grid_interval_midpoint = (size_t)(0.5 * (grid_interval_begin + grid_interval_end));

    if (dbg) {
      std::clog << "Considering an interval : " << p[int_no].first << "," << p[int_no].second << std::endl;

      std::clog << "grid_interval_begin : " << grid_interval_begin << std::endl;
      std::clog << "grid_interval_end : " << grid_interval_end << std::endl;
      std::clog << "grid_interval_midpoint : " << grid_interval_midpoint << std::endl;
    }

    double landscape_value = dx;
    for (size_t i = grid_interval_begin + 1; i < grid_interval_midpoint; ++i) {
      if (dbg) {
        std::clog << "Adding landscape value (going up) for a point : " << i << " equal : " << landscape_value
                  << std::endl;
      }
      if (number_of_levels != std::numeric_limits<unsigned>::max()) {
        // we have a heap of no more that number_of_levels values.
        // Note that if we are using heaps, we want to know the shortest distance in the heap.
        // This is achieved by putting -distance to the heap.
        if (this->values_of_landscapes[i].size() >= number_of_levels) {
          // in this case, the full heap is build, and we need to check if the landscape_value is not larger than the
          // smallest element in the heap.
          if (-landscape_value < this->values_of_landscapes[i].front()) {
            // if it is, we remove the largest value in the heap, and move on.
            std::pop_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] = -landscape_value;
            std::push_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
          }
        } else {
          // in this case we are still filling in the array.
          this->values_of_landscapes[i].push_back(-landscape_value);
          if (this->values_of_landscapes[i].size() == number_of_levels - 1) {
            // this->values_of_landscapes[i].size() == number_of_levels
            // in this case we need to create the heap.
            std::make_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
          }
        }
      } else {
        // we have vector of all values
        this->values_of_landscapes[i].push_back(landscape_value);
      }
      landscape_value += dx;
    }
    for (size_t i = grid_interval_midpoint; i <= grid_interval_end; ++i) {
      if (landscape_value > 0) {
        if (number_of_levels != std::numeric_limits<unsigned>::max()) {
          // we have a heap of no more that number_of_levels values
          if (this->values_of_landscapes[i].size() >= number_of_levels) {
            // in this case, the full heap is build, and we need to check if the landscape_value is not larger than the
            // smallest element in the heap.
            if (-landscape_value < this->values_of_landscapes[i].front()) {
              // if it is, we remove the largest value in the heap, and move on.
              std::pop_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
              this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] = -landscape_value;
              std::push_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            }
          } else {
            // in this case we are still filling in the array.
            this->values_of_landscapes[i].push_back(-landscape_value);
            if (this->values_of_landscapes[i].size() == number_of_levels - 1) {
              // this->values_of_landscapes[i].size() == number_of_levels
              // in this case we need to create the heap.
              std::make_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            }
          }
        } else {
          this->values_of_landscapes[i].push_back(landscape_value);
        }

        if (dbg) {
          std::clog << "Adding landscape value (going down) for a point : " << i << " equal : " << landscape_value
                    << std::endl;
        }
      }
      landscape_value -= dx;
    }
  }

  if (number_of_levels != std::numeric_limits<unsigned>::max()) {
    // in this case, vectors are used as heaps. And, since we want to have the smallest element at the top of
    // each heap, we store minus distances. To get if right at the end, we need to multiply each value
    // in the heap by -1 to get real vector of distances.
    for (size_t pt = 0; pt != this->values_of_landscapes.size(); ++pt) {
      for (size_t j = 0; j != this->values_of_landscapes[pt].size(); ++j) {
        this->values_of_landscapes[pt][j] *= -1;
      }
    }
  }

  // and now we need to sort the values:
  for (size_t pt = 0; pt != this->values_of_landscapes.size(); ++pt) {
    std::sort(this->values_of_landscapes[pt].begin(), this->values_of_landscapes[pt].end(), std::greater<double>());
  }
}